

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_VerifyBeforeCertRequest_Test::TestBody
          (SSLVersionTest_VerifyBeforeCertRequest_Test *this)

{
  bool bVar1;
  char *expected_predicate_value;
  AssertHelper AStack_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertionResult gtest_ar_;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined8 local_28;
  
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_cert_cb((this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      TestBody::anon_class_1_0_00000001::__invoke,(void *)0x0);
  client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
  server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
  local_78._16_8_ = &local_58;
  local_78._24_8_ = 0;
  local_58._8_8_ = 0;
  sStack_40 = 0;
  local_38._8_8_ = 0;
  local_78._0_8_ = (SSL_SESSION *)0x0;
  local_78._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
  local_48._M_p = (pointer)&local_38;
  local_58._M_allocated_capacity = 0;
  local_38._M_allocated_capacity = 0;
  local_28._0_4_ = 0;
  local_28._4_1_ = false;
  local_28._5_3_ = 0;
  expected_predicate_value = (char *)0x1;
  bVar1 = ConnectClientAndServer
                    (&client,&server,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (ClientConfig *)local_78,true);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ClientConfig::~ClientConfig((ClientConfig *)local_78);
  if (bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&gtest_ar_,
               (AssertionResult *)
               "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx_.get())",
               "true","false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x197f,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)local_78);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
  return;
}

Assistant:

TEST_P(SSLVersionTest, VerifyBeforeCertRequest) {
  // Configure the server to request client certificates.
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Configure the client to reject the server certificate.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_invalid; });

  // cert_cb should not be called. Verification should fail first.
  SSL_CTX_set_cert_cb(
      client_ctx_.get(),
      [](SSL *ssl, void *arg) {
        ADD_FAILURE() << "cert_cb unexpectedly called";
        return 0;
      },
      nullptr);

  bssl::UniquePtr<SSL> client, server;
  EXPECT_FALSE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                      server_ctx_.get()));
}